

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O1

void Png::handleError(png_structp png,char *msg)

{
  undefined8 *puVar1;
  Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:90:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:91:29)>
  local_38;
  __visit_result_t<Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:90:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:91:29)>,_const_std::variant<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>_&>
  local_30;
  
  puVar1 = (undefined8 *)png_get_error_ptr();
  local_38.super_anon_class_8_1_89901123.path = (anon_class_8_1_89901123)*puVar1;
  std::
  visit_abi_cxx11_<Visitor<File::string(std::filesystem::__cxx11::path_const&)const::_lambda(std::filebuf_const&)_1_,File::string[abi:cxx11](std::filesystem::__cxx11::path_const&)const::_lambda(std::streambuf_const*)_1_>,std::variant<std::streambuf*,std::filebuf>const&>
            (&local_30,&local_38,
             (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
              *)(puVar1 + 1));
  fatal("Error reading input image (\"%s\"): %s",local_30._M_dataplus._M_p,msg);
}

Assistant:

[[noreturn]] static void handleError(png_structp png, char const *msg) {
		Png *self = reinterpret_cast<Png *>(png_get_error_ptr(png));

		fatal("Error reading input image (\"%s\"): %s", self->string().c_str(), msg);
	}